

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.cpp
# Opt level: O3

void __thiscall
embree::TriangleMesh::convertToDeviceRepresentation
          (TriangleMesh *this,size_t offset,char *data_host,char *data_device)

{
  undefined8 *puVar1;
  BufferView<embree::Vec3fa> *pBVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  
  memcpy(data_host + offset,this,0x110);
  if ((this->super_Geometry).numTimeSteps != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pBVar2 = (this->vertices).items;
      *(undefined8 *)(data_host + lVar8 + offset + 0x140) =
           *(undefined8 *)((long)&(pBVar2->super_RawBufferView).buffer.ptr + lVar8);
      puVar1 = (undefined8 *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar8);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar2->super_RawBufferView).stride + lVar8);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar2->super_RawBufferView).format + lVar8);
      uVar7 = puVar1[1];
      *(undefined8 *)(data_host + lVar8 + offset + 0x130) = *puVar1;
      *(undefined8 *)(data_host + lVar8 + offset + 0x130 + 8) = uVar7;
      *(undefined8 *)(data_host + lVar8 + offset + 0x120) = uVar5;
      *(undefined8 *)(data_host + lVar8 + offset + 0x120 + 8) = uVar6;
      *(undefined8 *)(data_host + lVar8 + offset + 0x110) = uVar3;
      *(undefined8 *)(data_host + lVar8 + offset + 0x110 + 8) = uVar4;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x38;
    } while (uVar9 < (this->super_Geometry).numTimeSteps);
  }
  *(char **)(data_host + offset + 0xe0) = data_device + offset + 0x110;
  return;
}

Assistant:

void TriangleMesh::convertToDeviceRepresentation(size_t offset, char* data_host, char* data_device) const {
    TriangleMesh* mesh = (TriangleMesh*)(data_host + offset);
    std::memcpy(data_host + offset, (void*)this, sizeof(TriangleMesh));
    offset += sizeof(TriangleMesh);

    // store offset for overriding vertices pointer with device pointer after copying
    const size_t offsetVertices = offset;
    // copy vertices BufferViews for each time step
    for (size_t t = 0; t < numTimeSteps; ++t) {
      std::memcpy(data_host + offset, &(vertices[t]), sizeof(BufferView<Vec3fa>));
      offset += sizeof(BufferView<Vec3fa>);
    }
    // override vertices pointer with device ptr
    mesh->vertices.setDataPtr((BufferView<Vec3fa>*)(data_device + offsetVertices));
  }